

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableSize(PrintExpressionContents *this,TableSize *curr)

{
  ostream *o;
  string_view local_28;
  TableSize *local_18;
  TableSize *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (TableSize *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"table.size ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->table,this->o);
  return;
}

Assistant:

void visitTableSize(TableSize* curr) {
    printMedium(o, "table.size ");
    curr->table.print(o);
  }